

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *
kj::parse::
Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>
::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>
::apply(Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>
        *__return_storage_ptr__,
       Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
       *subParser,IteratorInput<char,_const_char_*> *input)

{
  bool bVar1;
  char *pcVar2;
  size_t newSize;
  IteratorInput<char,_const_char_*> subInput;
  Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> local_e8;
  IteratorInput<char,_const_char_*> local_c8;
  char local_a8;
  char *local_a0;
  size_t sStack_98;
  ArrayDisposer *local_90;
  unsigned_long *puStack_88;
  size_t local_80;
  ArrayDisposer *pAStack_78;
  Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *local_70;
  Maybe<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> local_68;
  
  local_e8.builder.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
  local_e8.builder.pos = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
  local_e8.builder.endPtr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
  local_e8.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_70 = __return_storage_ptr__;
  do {
    pcVar2 = input->pos;
    if (pcVar2 == input->end) break;
    local_c8.parent = input;
    local_c8.pos = pcVar2;
    local_c8.end = input->end;
    local_c8.best = pcVar2;
    Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
    ::parseNext<kj::parse::IteratorInput<char,_const_char_*>_>(&local_68,subParser,&local_c8);
    bVar1 = local_68.ptr.isSet;
    local_a8 = local_68.ptr.isSet;
    if (local_68.ptr.isSet == true) {
      local_a0 = local_68.ptr.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.
                 ptr;
      sStack_98 = local_68.ptr.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.
                  size_;
      local_68.ptr.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.ptr =
           (char *)0x0;
      local_68.ptr.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.size_ = 0;
      local_90 = local_68.ptr.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.
                 disposer;
      puStack_88 = local_68.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>
                   .value.ptr;
      local_80 = local_68.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.
                 value.size_;
      pAStack_78 = local_68.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>
                   .value.disposer;
      (local_c8.parent)->pos = local_c8.pos;
      if (local_e8.builder.pos == local_e8.builder.endPtr) {
        newSize = ((long)local_e8.builder.pos - (long)local_e8.builder.ptr >> 4) *
                  0x5555555555555556;
        if (local_e8.builder.pos == local_e8.builder.ptr) {
          newSize = 4;
        }
        Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::setCapacity(&local_e8,newSize)
        ;
      }
      ((local_e8.builder.pos)->impl).super_TupleElement<0U,_kj::String>.value.content.ptr = local_a0
      ;
      ((local_e8.builder.pos)->impl).super_TupleElement<0U,_kj::String>.value.content.size_ =
           sStack_98;
      ((local_e8.builder.pos)->impl).super_TupleElement<0U,_kj::String>.value.content.disposer =
           local_90;
      local_a0 = (char *)0x0;
      sStack_98 = 0;
      ((local_e8.builder.pos)->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr =
           puStack_88;
      ((local_e8.builder.pos)->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_ =
           local_80;
      ((local_e8.builder.pos)->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.
      disposer = pAStack_78;
      puStack_88 = (unsigned_long *)0x0;
      local_80 = 0;
      local_e8.builder.pos = local_e8.builder.pos + 1;
    }
    if (local_c8.parent != (IteratorInput<char,_const_char_*> *)0x0) {
      pcVar2 = local_c8.best;
      if (local_c8.best < local_c8.pos) {
        pcVar2 = local_c8.pos;
      }
      if (pcVar2 <= (local_c8.parent)->best) {
        pcVar2 = (local_c8.parent)->best;
      }
      (local_c8.parent)->best = pcVar2;
    }
  } while (bVar1 != false);
  if (local_e8.builder.pos != local_e8.builder.endPtr) {
    Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::setCapacity
              (&local_e8,
               ((long)local_e8.builder.pos - (long)local_e8.builder.ptr >> 4) * -0x5555555555555555)
    ;
  }
  (local_70->ptr).isSet = true;
  (local_70->ptr).field_1.value.ptr = local_e8.builder.ptr;
  (local_70->ptr).field_1.value.size_ =
       ((long)local_e8.builder.pos - (long)local_e8.builder.ptr >> 4) * -0x5555555555555555;
  (local_70->ptr).field_1.value.disposer = local_e8.builder.disposer;
  return local_70;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }